

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-swap8.h
# Opt level: O1

void swap8(void *value)

{
  undefined1 uVar1;
  
  uVar1 = *(undefined1 *)((long)value + 7);
  *(undefined1 *)((long)value + 7) = *value;
  *(undefined1 *)value = uVar1;
  uVar1 = *(undefined1 *)((long)value + 6);
  *(undefined1 *)((long)value + 6) = *(undefined1 *)((long)value + 1);
  *(undefined1 *)((long)value + 1) = uVar1;
  uVar1 = *(undefined1 *)((long)value + 5);
  *(undefined1 *)((long)value + 5) = *(undefined1 *)((long)value + 2);
  *(undefined1 *)((long)value + 2) = uVar1;
  uVar1 = *(undefined1 *)((long)value + 4);
  *(undefined1 *)((long)value + 4) = *(undefined1 *)((long)value + 3);
  *(undefined1 *)((long)value + 3) = uVar1;
  return;
}

Assistant:

static void swap8(void *value)
{
    unsigned char *v = (unsigned char *)value;

    /* use XOR swap algorithm to swap bytes 0/7, 1/6, 2/5, and 3/4 */
    v[0] = v[0] ^ v[7];
    v[7] = v[0] ^ v[7];
    v[0] = v[0] ^ v[7];
    v[1] = v[1] ^ v[6];
    v[6] = v[1] ^ v[6];
    v[1] = v[1] ^ v[6];
    v[2] = v[2] ^ v[5];
    v[5] = v[2] ^ v[5];
    v[2] = v[2] ^ v[5];
    v[3] = v[3] ^ v[4];
    v[4] = v[3] ^ v[4];
    v[3] = v[3] ^ v[4];
}